

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O2

void __thiscall stackjit::ExecutionEngine::load(ExecutionEngine *this,bool loadFunctionBodies)

{
  Function *this_00;
  pointer ppAVar1;
  AssemblyImage *this_01;
  bool bVar2;
  Binder *this_02;
  vector<stackjit::AssemblyImage_*,_std::allocator<stackjit::AssemblyImage_*>_> *pvVar3;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Function,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Function>_>_>
  *puVar4;
  string *psVar5;
  ClassType *this_03;
  ClassMetadata *this_04;
  FunctionDefinition *funcDef_00;
  ClassMetadataProvider *this_05;
  runtime_error *this_06;
  pointer ppAVar6;
  __node_base *p_Var7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string signature;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  string local_180;
  FunctionDefinition local_160;
  FunctionDefinition funcDef;
  
  this_02 = VMState::binder(this->mVMState);
  if (this->mHasMainInitialized == false) {
    loadRuntimeLibrary(this);
  }
  ClassLoader::loadClasses(&this->mClassLoader,&this->mImageContainer);
  if (this->mHasMainInitialized == false) {
    NativeLibrary::add(this->mVMState);
    if ((this->mVMState->config).testMode == true) {
      TestLibrary::add(this->mVMState);
    }
    this->mHasMainInitialized = true;
  }
  pvVar3 = ImageContainer::images(&this->mImageContainer);
  ppAVar6 = (pvVar3->
            super__Vector_base<stackjit::AssemblyImage_*,_std::allocator<stackjit::AssemblyImage_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppAVar1 = (pvVar3->
            super__Vector_base<stackjit::AssemblyImage_*,_std::allocator<stackjit::AssemblyImage_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppAVar6 == ppAVar1) {
      this_05 = VMState::classProvider(this->mVMState);
      ClassMetadataProvider::createVirtualFunctionTables(this_05,this->mVMState);
      return;
    }
    bVar2 = AssemblyImage::hasLoadedDefinitions(*ppAVar6);
    if (!bVar2) {
      puVar4 = AssemblyImage::functions_abi_cxx11_(*ppAVar6);
      p_Var7 = &(puVar4->_M_h)._M_before_begin;
      while (p_Var7 = p_Var7->_M_nxt, p_Var7 != (__node_base *)0x0) {
        FunctionDefinition::FunctionDefinition(&funcDef);
        if (loadFunctionBodies) {
          this_01 = *ppAVar6;
          std::__cxx11::string::string((string *)&local_180,(string *)(p_Var7 + 1));
          AssemblyImage::loadFunctionBody(this_01,&local_180);
          std::__cxx11::string::~string((string *)&local_180);
        }
        this_00 = (Function *)(p_Var7 + 5);
        bVar2 = Loader::Function::isExternal(this_00);
        if (bVar2) {
          FunctionLoader::loadExternal(&this->mFunctionLoader,this_00,&funcDef);
        }
        else {
          FunctionLoader::generateDefinition(&this->mFunctionLoader,this_00,&funcDef);
          FunctionSignature::from((FunctionSignature *)&local_1e0,&funcDef);
          psVar5 = FunctionSignature::str_abi_cxx11_((FunctionSignature *)&local_1e0);
          std::__cxx11::string::string((string *)&signature,(string *)psVar5);
          std::__cxx11::string::~string((string *)&local_1e0);
          bVar2 = Binder::isDefined(this_02,&signature);
          if (bVar2) {
            this_06 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::operator+(&local_1a0,"The function \'",&signature);
            std::operator+(&local_1e0,&local_1a0,"\' is already defined.");
            std::runtime_error::runtime_error(this_06,(string *)&local_1e0);
            __cxa_throw(this_06,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          std::__cxx11::string::~string((string *)&signature);
        }
        FunctionDefinition::FunctionDefinition(&local_160,&funcDef);
        Binder::define(this_02,&local_160);
        FunctionDefinition::~FunctionDefinition(&local_160);
        bVar2 = FunctionDefinition::isVirtual(&funcDef);
        if (bVar2) {
          this_03 = FunctionDefinition::classType(&funcDef);
          this_04 = ClassType::metadata(this_03);
          funcDef_00 = Binder::getFunction(this_02,(string *)(p_Var7 + 1));
          ClassMetadata::addVirtualFunction(this_04,funcDef_00);
        }
        FunctionDefinition::~FunctionDefinition(&funcDef);
      }
      AssemblyImage::loadedDefinitions(*ppAVar6);
    }
    ppAVar6 = ppAVar6 + 1;
  } while( true );
}

Assistant:

void ExecutionEngine::load(bool loadFunctionBodies) {
		auto& binder = mVMState.binder();

		if (!mHasMainInitialized) {
			//Load runtime library
			loadRuntimeLibrary();
		}

		//Load classes
		mClassLoader.loadClasses(mImageContainer);

		if (!mHasMainInitialized) {
			//Load native functions
			NativeLibrary::add(mVMState);

			//Load test functions
			if (mVMState.config.testMode) {
				TestLibrary::add(mVMState);
			}

			mHasMainInitialized = true; //Mark that the main initialization has been made
		}

		//Load functions
		for (auto& image : mImageContainer.images()) {
			if (image->hasLoadedDefinitions()) {
				continue;
			}

			for (auto& current : image->functions()) {
				auto& currentFunc = current.second;
				FunctionDefinition funcDef;

				if (loadFunctionBodies) {
					image->loadFunctionBody(current.first);
				}

				if (!currentFunc.isExternal()) {
					mFunctionLoader.generateDefinition(currentFunc, funcDef);

					auto signature = FunctionSignature::from(funcDef).str();
					if (binder.isDefined(signature)) {
						throw std::runtime_error("The function '" + signature + "' is already defined.");
					}
				} else {
					mFunctionLoader.loadExternal(currentFunc, funcDef);
				}

				binder.define(funcDef);

				//Add virtual functions to the class
				if (funcDef.isVirtual()) {
					funcDef.classType()->metadata()->addVirtualFunction(binder.getFunction(current.first));
				}
			}

			image->loadedDefinitions();
		}

		//Create virtual function tables
		mVMState.classProvider().createVirtualFunctionTables(mVMState);
	}